

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx
          (GmmGen12CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  uint8_t uVar1;
  GMM_PRIVATE_PAT *pGVar2;
  GMM_PRIVATE_PAT *pGVar3;
  uint32_t PATIdx_00;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  GMM_PRIVATE_PAT PAT2;
  GMM_PRIVATE_PAT PAT1;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  WA_TABLE *local_30;
  WA_TABLE *pWaTable;
  GMM_GFX_MEMORY_TYPE MemoryType;
  GMM_GFX_MEMORY_TYPE WantedMemoryType;
  uint32_t PATIdx;
  uint32_t i;
  GmmGen12CachePolicy *this_local;
  
  MemoryType = GMM_GFX_UC_WITH_FENCE;
  pWaTable._4_4_ = 0;
  _PATIdx = this;
  local_30 = Context::GetWaTable((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                 super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon.pGmmLibContext);
  memcpy(&PAT2,&CachePolicy,0x28);
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_50;
  CachePolicy_00._0_8_ = _PAT2;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_48;
  CachePolicy_00.field_3 =
       (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_48._4_4_;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_40;
  CachePolicy_00.Override = (undefined4)local_38;
  CachePolicy_00.IsOverridenByRegkey = local_38._4_4_;
  pWaTable._4_4_ =
       GmmCachePolicyCommon::GetWantedMemoryType((GmmCachePolicyCommon *)this,CachePolicy_00);
  if ((*(ulong *)&local_30->field_0x4 >> 0x1f & 1) != 0) {
    pWaTable._4_4_ = GMM_GFX_UC_WITH_FENCE;
  }
  uVar4 = extraout_RDX;
  for (WantedMemoryType = GMM_GFX_WC;
      WantedMemoryType <
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters;
      WantedMemoryType = WantedMemoryType + GMM_GFX_WC) {
    pGVar2 = GmmGen8CachePolicy::GetPrivatePATEntry
                       ((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)MemoryType,
                        (uint32_t)uVar4);
    pGVar3 = GmmGen8CachePolicy::GetPrivatePATEntry
                       ((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)WantedMemoryType,
                        PATIdx_00);
    uVar1 = SelectNewPATIdx(this,pWaTable._4_4_,(GMM_GFX_MEMORY_TYPE)pGVar2 & GMM_GFX_WB,
                            (GMM_GFX_MEMORY_TYPE)pGVar3 & GMM_GFX_WB);
    if (uVar1 != '\0') {
      MemoryType = WantedMemoryType;
    }
    uVar4 = extraout_RDX_00;
  }
  pGVar2 = GmmGen8CachePolicy::GetPrivatePATEntry
                     ((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)MemoryType,
                      (uint32_t)uVar4);
  if (((GMM_GFX_MEMORY_TYPE)pGVar2 & GMM_GFX_WB) == pWaTable._4_4_) {
    this_local._4_4_ = MemoryType;
  }
  else {
    this_local._4_4_ = ~GMM_GFX_UC_WITH_FENCE;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t            i;
    uint32_t            PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    WA_TABLE *          pWaTable         = &const_cast<WA_TABLE &>(pGmmLibContext->GetWaTable());

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    // Override wantedMemoryType so that PAT.MT is UC
    // Gen12 uses max function to resolve PAT-vs-MOCS MemType, So unless PTE.PAT says UC, MOCS won't be able to set UC!
    if(pWaTable->WaMemTypeIsMaxOfPatAndMocs)
    {
        WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT1.Gen12.MemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT2.Gen12.MemoryType))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).Gen12.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}